

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_HTML.h
# Opt level: O0

HTMLElement * __thiscall choc::html::HTMLElement::addLineBreak(HTMLElement *this)

{
  HTMLElement *pHVar1;
  allocator<char> local_31;
  string local_30;
  HTMLElement *local_10;
  HTMLElement *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"<br>",&local_31);
  pHVar1 = addRawContent(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return pHVar1;
}

Assistant:

HTMLElement& addLineBreak()                         { return addRawContent ("<br>"); }